

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::FormatStrSS<std::__cxx11::stringstream,char[36],int,char[32],int,char[14]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [36],int *RestArgs,char (*RestArgs_1) [32],int *RestArgs_2,
               char (*RestArgs_3) [14])

{
  char (*RestArgs_local_3) [14];
  int *RestArgs_local_2;
  char (*RestArgs_local_1) [32];
  int *RestArgs_local;
  char (*FirstArg_local) [36];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[36]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,int,char[32],int,char[14]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}